

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O2

void __thiscall
testing::internal::
TypedExpectation<std::unique_ptr<const_void,_void_(*)(const_void_*)>_(pstore::address,_unsigned_long,_bool)>
::~TypedExpectation(TypedExpectation<std::unique_ptr<const_void,_void_(*)(const_void_*)>_(pstore::address,_unsigned_long,_bool)>
                    *this)

{
  _Function_base *this_00;
  pointer ppvVar1;
  
  (this->super_ExpectationBase)._vptr_ExpectationBase =
       (_func_int **)&PTR__TypedExpectation_00255d60;
  ExpectationBase::CheckActionCountIfNotDone(&this->super_ExpectationBase);
  for (ppvVar1 = (this->super_ExpectationBase).untyped_actions_.
                 super__Vector_base<const_void_*,_std::allocator<const_void_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      ppvVar1 !=
      (this->super_ExpectationBase).untyped_actions_.
      super__Vector_base<const_void_*,_std::allocator<const_void_*>_>._M_impl.
      super__Vector_impl_data._M_finish; ppvVar1 = ppvVar1 + 1) {
    this_00 = (_Function_base *)*ppvVar1;
    if (this_00 != (_Function_base *)0x0) {
      std::_Function_base::~_Function_base(this_00);
    }
    operator_delete(this_00,0x20);
  }
  std::_Function_base::~_Function_base((_Function_base *)&this->repeated_action_);
  MatcherBase<const_std::tuple<pstore::address,_unsigned_long,_bool>_&>::~MatcherBase
            (&(this->extra_matcher_).
              super_MatcherBase<const_std::tuple<pstore::address,_unsigned_long,_bool>_&>);
  std::
  _Tuple_impl<0UL,_testing::Matcher<pstore::address>,_testing::Matcher<unsigned_long>,_testing::Matcher<bool>_>
  ::~_Tuple_impl(&(this->matchers_).
                  super__Tuple_impl<0UL,_testing::Matcher<pstore::address>,_testing::Matcher<unsigned_long>,_testing::Matcher<bool>_>
                );
  ExpectationBase::~ExpectationBase(&this->super_ExpectationBase);
  return;
}

Assistant:

~TypedExpectation() override {
    // Check the validity of the action count if it hasn't been done
    // yet (for example, if the expectation was never used).
    CheckActionCountIfNotDone();
    for (UntypedActions::const_iterator it = untyped_actions_.begin();
         it != untyped_actions_.end(); ++it) {
      delete static_cast<const Action<F>*>(*it);
    }
  }